

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

void soplex::MPSreadName(MPSInput *mps,SPxOut *spxout)

{
  bool bVar1;
  int iVar2;
  Verbosity VVar3;
  char *pcVar4;
  SPxOut *in_RSI;
  MPSInput *in_RDI;
  Verbosity old_verbosity;
  MPSInput *in_stack_00000068;
  _func_ostream_ptr_ostream_ptr *in_stack_ffffffffffffffc8;
  MPSInput *in_stack_ffffffffffffffd0;
  undefined4 local_18;
  Verbosity local_14;
  SPxOut *local_10;
  MPSInput *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar1 = MPSInput::readLine(in_stack_00000068);
  if ((bVar1) && (pcVar4 = MPSInput::field0(local_8), pcVar4 != (char *)0x0)) {
    pcVar4 = MPSInput::field0(local_8);
    iVar2 = strcmp(pcVar4,"NAME");
    if (iVar2 == 0) {
      pcVar4 = MPSInput::field1(local_8);
      if (pcVar4 != (char *)0x0) {
        MPSInput::field1(local_8);
      }
      MPSInput::setProbName(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
      if ((local_10 != (SPxOut *)0x0) && (VVar3 = SPxOut::getVerbosity(local_10), 3 < (int)VVar3)) {
        local_14 = SPxOut::getVerbosity(local_10);
        local_18 = 4;
        (*local_10->_vptr_SPxOut[2])(local_10,&local_18);
        in_stack_ffffffffffffffd0 =
             (MPSInput *)
             operator<<((SPxOut *)in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
        MPSInput::probName(local_8);
        operator<<((SPxOut *)in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
        operator<<((SPxOut *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        (*local_10->_vptr_SPxOut[2])(local_10,&local_14);
      }
      bVar1 = MPSInput::readLine(in_stack_00000068);
      if ((bVar1) && (pcVar4 = MPSInput::field0(local_8), pcVar4 != (char *)0x0)) {
        pcVar4 = MPSInput::field0(local_8);
        iVar2 = strcmp(pcVar4,"ROWS");
        if (iVar2 == 0) {
          MPSInput::setSection(local_8,ROWS);
          return;
        }
        pcVar4 = MPSInput::field0(local_8);
        iVar2 = strncmp(pcVar4,"OBJSEN",6);
        if (iVar2 == 0) {
          MPSInput::setSection(local_8,OBJSEN);
          return;
        }
        pcVar4 = MPSInput::field0(local_8);
        iVar2 = strcmp(pcVar4,"OBJNAME");
        if (iVar2 == 0) {
          MPSInput::setSection(local_8,OBJNAME);
          return;
        }
      }
    }
  }
  MPSInput::syntaxError(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

static inline void MPSreadName(MPSInput& mps, SPxOut* spxout)
{
   do
   {
      // This has to be the Line with the NAME section.
      if(!mps.readLine() || (mps.field0() == nullptr) || strcmp(mps.field0(), "NAME"))
         break;

      // Sometimes the name is omitted.
      mps.setProbName((mps.field1() == nullptr) ? "_MPS_" : mps.field1());

      SPX_MSG_INFO2((*spxout), (*spxout) << "IMPSRD01 Problem name   : " << mps.probName() << std::endl;)

      // This has to be a new section
      if(!mps.readLine() || (mps.field0() == nullptr))
         break;

      if(!strcmp(mps.field0(), "ROWS"))
         mps.setSection(MPSInput::ROWS);
      else if(!strncmp(mps.field0(), "OBJSEN", 6))
         mps.setSection(MPSInput::OBJSEN);
      else if(!strcmp(mps.field0(), "OBJNAME"))
         mps.setSection(MPSInput::OBJNAME);
      else
         break;

      return;
   }
   while(false);

   mps.syntaxError();
}